

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_unlk_32_a7(void)

{
  m68ki_cpu.dar[0xf] = m68ki_read_32_fc(m68ki_cpu.dar[0xf],m68ki_address_space | m68ki_cpu.s_flag);
  return;
}

Assistant:

static void m68k_op_unlk_32_a7(void)
{
	REG_A[7] = m68ki_read_32(REG_A[7]);
}